

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::(anonymous_namespace)::AsyncPipe::whenWriteDisconnected(AsyncPipe *this)

{
  anon_unknown_123::AsyncPipe::whenWriteDisconnected((AsyncPipe *)this);
  return;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    if (readAborted) {
      return kj::READY_NOW;
    } else KJ_IF_SOME(p, readAbortPromise) {
      return p.addBranch();
    } else {
      auto paf = newPromiseAndFulfiller<void>();
      readAbortFulfiller = kj::mv(paf.fulfiller);
      auto fork = paf.promise.fork();
      auto result = fork.addBranch();
      readAbortPromise = kj::mv(fork);
      return result;
    }